

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&> * __thiscall
Catch::ExprLhs<protozero::data_view_const&>::operator!=
          (BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>
           *__return_storage_ptr__,ExprLhs<protozero::data_view_const&> *this,data_view *rhs)

{
  data_view *lhs;
  bool comparisonResult;
  StringRef local_30;
  data_view *local_20;
  data_view *rhs_local;
  ExprLhs<const_protozero::data_view_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (data_view *)this;
  this_local = (ExprLhs<const_protozero::data_view_&> *)__return_storage_ptr__;
  comparisonResult =
       compareNotEqual<protozero::data_view,protozero::data_view_const&>(*(data_view **)this,rhs);
  lhs = *(data_view **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }